

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall
gvr::PLYReader::getComments
          (PLYReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *clist)

{
  pointer ppPVar1;
  pointer ppPVar2;
  ulong uVar3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(clist);
  ppPVar1 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar2 != ppPVar1) {
    uVar3 = 0;
    do {
      if (ppPVar1[uVar3]->size < 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(clist,&ppPVar1[uVar3]->name);
        ppPVar1 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppPVar2 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)ppPVar2 - (long)ppPVar1 >> 3));
  }
  return;
}

Assistant:

void PLYReader::getComments(std::vector<std::string> &clist) const
{
  clist.clear();

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getInstances() < 0)
    {
      clist.push_back(list[i]->getName());
    }
  }
}